

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
__thiscall Kernel::PolyNf::wrapPoly<Kernel::NumTraits<Kernel::RealConstantType>>(PolyNf *this)

{
  bool bVar1;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  *t;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *extraout_RDX;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *extraout_RDX_00;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *pPVar2;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  *in_RDI;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  PVar3;
  PolyNf *in_stack_ffffffffffffff78;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffffb8;
  PolyNf *in_stack_ffffffffffffffc8;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffffd0;
  
  bVar1 = Lib::
          Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ::is<Kernel::AnyPoly>
                    ((Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                      *)0x4562b0);
  if (bVar1) {
    Lib::
    Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ::unwrap<Kernel::AnyPoly>
              ((Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                *)0x4562c0);
    t = Lib::
        Coproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>>
        ::
        unwrap<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>>
                  ((Coproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                    *)0x4562c8);
    Lib::
    Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
    ::Perfect(in_RDI,t);
    pPVar2 = extraout_RDX;
  }
  else {
    PolyNf((PolyNf *)&stack0xffffffffffffffb8,in_stack_ffffffffffffff78);
    Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    Lib::
    perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
              (in_stack_ffffffffffffffb8);
    Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Polynom
              ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x45631a);
    pPVar2 = extraout_RDX_00;
  }
  PVar3._ptr = pPVar2;
  PVar3._0_8_ = in_RDI;
  return PVar3;
}

Assistant:

Perfect<Polynom<Number>> PolyNf::wrapPoly() const
{
  if (this->is<AnyPoly>()) {
    return this->unwrap<AnyPoly>()
            .unwrap<Perfect<Polynom<Number>>>();
  } else {
    return perfect(Polynom<Number>(*this));
  }
}